

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void n_array_suite::n_array_incomplete(void)

{
  char input [5];
  reader reader;
  undefined4 local_184;
  return_type local_180;
  char local_160 [8];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_160,"[\"x\"",5);
  local_180._M_dataplus._M_p = (pointer)strlen(local_160);
  local_180._M_string_length = (size_type)local_160;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,(view_type *)&local_180);
  local_184 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,600,"void n_array_suite::n_array_incomplete()",&local_180,&local_184);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_184 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x25a,"void n_array_suite::n_array_incomplete()",&local_180,&local_184);
  trial::protocol::json::basic_reader<char>::
  overloader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::value(&local_180,&local_158);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("reader.value<std::string>()","\"x\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x25b,"void n_array_suite::n_array_incomplete()",&local_180,"x");
  std::__cxx11::string::~string((string *)&local_180);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_180._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
  local_184 = 0xfffffff9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_expected_end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x25d,"void n_array_suite::n_array_incomplete()",&local_180,&local_184);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void n_array_incomplete()
{
    const char input[] = "[\"x\"";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "x");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_expected_end_array);
}